

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_backup_step(sqlite3_backup *p,int nPage)

{
  u8 uVar1;
  u32 uVar2;
  u32 uVar3;
  uint uVar4;
  sqlite3_mutex *psVar5;
  Btree *pBVar6;
  Pager *pPVar7;
  Pager *pPager;
  BtShared *pBVar8;
  BtShared *pBVar9;
  sqlite3_file *psVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  Pgno PVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long in_FS_OFFSET;
  bool bVar20;
  DbPage *pSrcPg;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar5 = p->pSrcDb->mutex;
  if (psVar5 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar5);
  }
  sqlite3BtreeEnter(p->pSrc);
  if ((p->pDestDb != (sqlite3 *)0x0) && (psVar5 = p->pDestDb->mutex, psVar5 != (sqlite3_mutex *)0x0)
     ) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar5);
  }
  uVar14 = p->rc;
  if ((6 < uVar14) || ((0x61U >> (uVar14 & 0x1f) & 1) == 0)) goto LAB_001220bf;
  pBVar6 = p->pSrc;
  pPVar7 = pBVar6->pBt->pPager;
  pPager = p->pDest->pBt->pPager;
  if ((p->pDestDb == (sqlite3 *)0x0) || (pBVar6->pBt->inTransaction != '\x02')) {
    if (pBVar6->inTrans != '\0') {
      uVar13 = 0;
      goto LAB_00121c6b;
    }
    bVar11 = false;
    uVar13 = sqlite3BtreeBeginTrans(pBVar6,0,(int *)0x0);
  }
  else {
    uVar13 = 5;
LAB_00121c6b:
    bVar11 = true;
  }
  iVar12 = p->bDestLocked;
  if (iVar12 == 0 && uVar13 == 0) {
    iVar12 = sqlite3BtreeSetPageSize(p->pDest,p->pSrc->pBt->pageSize,0,0);
    uVar13 = 7;
    if (iVar12 != 7) {
      iVar12 = p->bDestLocked;
LAB_00121cc0:
      uVar13 = 0;
      if ((iVar12 == 0) &&
         (uVar13 = sqlite3BtreeBeginTrans(p->pDest,2,(int *)&p->iDestSchema), uVar13 == 0)) {
        p->bDestLocked = 1;
        uVar13 = 0;
      }
    }
  }
  else if (uVar13 == 0) goto LAB_00121cc0;
  pBVar8 = p->pSrc->pBt;
  uVar2 = pBVar8->pageSize;
  lVar15 = (long)(int)uVar2;
  pBVar9 = p->pDest->pBt;
  uVar3 = pBVar9->pageSize;
  uVar1 = pBVar9->pPager->journalMode;
  if (uVar13 == 0) {
    uVar13 = 0;
    if (uVar1 != '\x05') {
      bVar20 = false;
      if (pPager->tempFile == '\0') {
        bVar20 = pPager->memVfs == '\0';
      }
      if (bVar20) goto LAB_00121d41;
    }
    if (uVar2 != uVar3) {
      uVar13 = 8;
    }
  }
LAB_00121d41:
  uVar14 = pBVar8->nPage;
  iVar12 = 0;
  while (((iVar12 < nPage || nPage < 0 && (PVar16 = p->iNext, PVar16 <= uVar14)) && (uVar13 == 0)))
  {
    uVar13 = 0;
    if (PVar16 != (uint)sqlite3PendingByte / p->pSrc->pBt->pageSize + 1) {
      pSrcPg = (DbPage *)&DAT_aaaaaaaaaaaaaaaa;
      uVar13 = (*pPVar7->xGet)(pPVar7,PVar16,&pSrcPg,2);
      if (uVar13 == 0) {
        uVar13 = backupOnePage(p,PVar16,(u8 *)pSrcPg->pData,0);
        sqlite3PagerUnref(pSrcPg);
      }
      PVar16 = p->iNext;
    }
    p->iNext = PVar16 + 1;
    iVar12 = iVar12 + 1;
  }
  if (uVar13 == 0x65) {
LAB_00121e17:
    if (uVar14 == 0) {
      uVar14 = 1;
      pBVar6 = p->pDest;
      sqlite3BtreeEnter(pBVar6);
      pBVar8 = pBVar6->pBt;
      pBVar8->nPage = 0;
      uVar13 = newDatabase(pBVar8);
      sqlite3BtreeLeave(pBVar6);
      if ((uVar13 != 0x65) && (uVar13 != 0)) goto LAB_00122091;
    }
    uVar13 = sqlite3BtreeUpdateMeta(p->pDest,1,p->iDestSchema + 1);
    if (uVar13 == 0) {
      if (p->pDestDb != (sqlite3 *)0x0) {
        sqlite3ResetAllSchemasOfConnection(p->pDestDb);
      }
      if ((uVar1 != '\x05') || (uVar13 = sqlite3BtreeSetVersion(p->pDest,2), uVar13 == 0)) {
        if ((int)uVar2 < (int)uVar3) {
          iVar12 = (int)((int)uVar3 / (int)uVar2 + uVar14 + -1) / ((int)uVar3 / (int)uVar2);
          uVar13 = 0;
          psVar10 = pPager->fd;
          uVar4 = pPager->dbSize;
          for (PVar16 = iVar12 - (uint)(iVar12 ==
                                       (uint)sqlite3PendingByte / p->pDest->pBt->pageSize + 1);
              (uVar13 == 0 && (PVar16 <= uVar4)); PVar16 = PVar16 + 1) {
            uVar13 = 0;
            if (PVar16 != (uint)sqlite3PendingByte / p->pDest->pBt->pageSize + 1) {
              pSrcPg = (DbPage *)&DAT_aaaaaaaaaaaaaaaa;
              uVar13 = (*pPager->xGet)(pPager,PVar16,&pSrcPg,0);
              if (uVar13 == 0) {
                uVar13 = sqlite3PagerWrite(pSrcPg);
                sqlite3PagerUnref(pSrcPg);
              }
            }
          }
          lVar17 = (int)uVar14 * lVar15;
          if (uVar13 == 0) {
            uVar13 = sqlite3PagerCommitPhaseOne(pPager,(char *)0x0,1);
          }
          lVar19 = (long)(int)(uVar3 + sqlite3PendingByte);
          if (lVar17 < (int)(uVar3 + sqlite3PendingByte)) {
            lVar19 = lVar17;
          }
          for (lVar18 = (long)(int)(sqlite3PendingByte + uVar2); (uVar13 == 0 && (lVar18 < lVar19));
              lVar18 = lVar18 + lVar15) {
            pSrcPg = (DbPage *)0x0;
            uVar13 = (*pPVar7->xGet)(pPVar7,(int)(lVar18 / lVar15) + 1,&pSrcPg,0);
            if (uVar13 == 0) {
              uVar13 = (*psVar10->pMethods->xWrite)(psVar10,pSrcPg->pData,uVar2,lVar18);
            }
            sqlite3PagerUnref(pSrcPg);
          }
          if (uVar13 == 0) {
            pSrcPg = (DbPage *)&DAT_aaaaaaaaaaaaaaaa;
            uVar13 = (*psVar10->pMethods->xFileSize)(psVar10,(sqlite3_int64 *)&pSrcPg);
            if ((uVar13 == 0) &&
               (((long)pSrcPg <= lVar17 ||
                (uVar13 = (*psVar10->pMethods->xTruncate)(psVar10,lVar17), uVar13 == 0)))) {
              uVar13 = sqlite3PagerSync(pPager,(char *)0x0);
              goto LAB_00121fb1;
            }
          }
        }
        else {
          pPager->dbSize = ((int)uVar2 / (int)uVar3) * uVar14;
          uVar13 = sqlite3PagerCommitPhaseOne(pPager,(char *)0x0,0);
LAB_00121fb1:
          if (uVar13 == 0) {
            uVar14 = sqlite3BtreeCommitPhaseTwo(p->pDest,0);
            uVar13 = 0x65;
            if (uVar14 != 0) {
              uVar13 = uVar14;
            }
          }
        }
      }
    }
  }
  else if (uVar13 == 0) {
    p->nPagecount = uVar14;
    p->nRemaining = (uVar14 - p->iNext) + 1;
    if (uVar14 < p->iNext) goto LAB_00121e17;
    uVar13 = 0;
    if (p->isAttached == 0) {
      pPVar7 = p->pSrc->pBt->pPager;
      p->pNext = pPVar7->pBackup;
      pPVar7->pBackup = p;
      p->isAttached = 1;
    }
  }
LAB_00122091:
  if (!bVar11) {
    sqlite3BtreeCommitPhaseOne(p->pSrc,(char *)0x0);
    sqlite3BtreeCommitPhaseTwo(p->pSrc,0);
  }
  uVar14 = 7;
  if (uVar13 != 0xc0a) {
    uVar14 = uVar13;
  }
  p->rc = uVar14;
LAB_001220bf:
  if ((p->pDestDb != (sqlite3 *)0x0) && (psVar5 = p->pDestDb->mutex, psVar5 != (sqlite3_mutex *)0x0)
     ) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar5);
  }
  sqlite3BtreeLeave(p->pSrc);
  psVar5 = p->pSrcDb->mutex;
  if (psVar5 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar14;
}

Assistant:

SQLITE_API int sqlite3_backup_step(sqlite3_backup *p, int nPage){
  int rc;
  int destMode;       /* Destination journal mode */
  int pgszSrc = 0;    /* Source page size */
  int pgszDest = 0;   /* Destination page size */

#ifdef SQLITE_ENABLE_API_ARMOR
  if( p==0 ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(p->pSrcDb->mutex);
  sqlite3BtreeEnter(p->pSrc);
  if( p->pDestDb ){
    sqlite3_mutex_enter(p->pDestDb->mutex);
  }

  rc = p->rc;
  if( !isFatalError(rc) ){
    Pager * const pSrcPager = sqlite3BtreePager(p->pSrc);     /* Source pager */
    Pager * const pDestPager = sqlite3BtreePager(p->pDest);   /* Dest pager */
    int ii;                            /* Iterator variable */
    int nSrcPage = -1;                 /* Size of source db in pages */
    int bCloseTrans = 0;               /* True if src db requires unlocking */

    /* If the source pager is currently in a write-transaction, return
    ** SQLITE_BUSY immediately.
    */
    if( p->pDestDb && p->pSrc->pBt->inTransaction==TRANS_WRITE ){
      rc = SQLITE_BUSY;
    }else{
      rc = SQLITE_OK;
    }

    /* If there is no open read-transaction on the source database, open
    ** one now. If a transaction is opened here, then it will be closed
    ** before this function exits.
    */
    if( rc==SQLITE_OK && SQLITE_TXN_NONE==sqlite3BtreeTxnState(p->pSrc) ){
      rc = sqlite3BtreeBeginTrans(p->pSrc, 0, 0);
      bCloseTrans = 1;
    }

    /* If the destination database has not yet been locked (i.e. if this
    ** is the first call to backup_step() for the current backup operation),
    ** try to set its page size to the same as the source database. This
    ** is especially important on ZipVFS systems, as in that case it is
    ** not possible to create a database file that uses one page size by
    ** writing to it with another.  */
    if( p->bDestLocked==0 && rc==SQLITE_OK && setDestPgsz(p)==SQLITE_NOMEM ){
      rc = SQLITE_NOMEM;
    }

    /* Lock the destination database, if it is not locked already. */
    if( SQLITE_OK==rc && p->bDestLocked==0
     && SQLITE_OK==(rc = sqlite3BtreeBeginTrans(p->pDest, 2,
                                                (int*)&p->iDestSchema))
    ){
      p->bDestLocked = 1;
    }

    /* Do not allow backup if the destination database is in WAL mode
    ** and the page sizes are different between source and destination */
    pgszSrc = sqlite3BtreeGetPageSize(p->pSrc);
    pgszDest = sqlite3BtreeGetPageSize(p->pDest);
    destMode = sqlite3PagerGetJournalMode(sqlite3BtreePager(p->pDest));
    if( SQLITE_OK==rc
     && (destMode==PAGER_JOURNALMODE_WAL || sqlite3PagerIsMemdb(pDestPager))
     && pgszSrc!=pgszDest
    ){
      rc = SQLITE_READONLY;
    }

    /* Now that there is a read-lock on the source database, query the
    ** source pager for the number of pages in the database.
    */
    nSrcPage = (int)sqlite3BtreeLastPage(p->pSrc);
    assert( nSrcPage>=0 );
    for(ii=0; (nPage<0 || ii<nPage) && p->iNext<=(Pgno)nSrcPage && !rc; ii++){
      const Pgno iSrcPg = p->iNext;                 /* Source page number */
      if( iSrcPg!=PENDING_BYTE_PAGE(p->pSrc->pBt) ){
        DbPage *pSrcPg;                             /* Source page object */
        rc = sqlite3PagerGet(pSrcPager, iSrcPg, &pSrcPg,PAGER_GET_READONLY);
        if( rc==SQLITE_OK ){
          rc = backupOnePage(p, iSrcPg, sqlite3PagerGetData(pSrcPg), 0);
          sqlite3PagerUnref(pSrcPg);
        }
      }
      p->iNext++;
    }
    if( rc==SQLITE_OK ){
      p->nPagecount = nSrcPage;
      p->nRemaining = nSrcPage+1-p->iNext;
      if( p->iNext>(Pgno)nSrcPage ){
        rc = SQLITE_DONE;
      }else if( !p->isAttached ){
        attachBackupObject(p);
      }
    }

    /* Update the schema version field in the destination database. This
    ** is to make sure that the schema-version really does change in
    ** the case where the source and destination databases have the
    ** same schema version.
    */
    if( rc==SQLITE_DONE ){
      if( nSrcPage==0 ){
        rc = sqlite3BtreeNewDb(p->pDest);
        nSrcPage = 1;
      }
      if( rc==SQLITE_OK || rc==SQLITE_DONE ){
        rc = sqlite3BtreeUpdateMeta(p->pDest,1,p->iDestSchema+1);
      }
      if( rc==SQLITE_OK ){
        if( p->pDestDb ){
          sqlite3ResetAllSchemasOfConnection(p->pDestDb);
        }
        if( destMode==PAGER_JOURNALMODE_WAL ){
          rc = sqlite3BtreeSetVersion(p->pDest, 2);
        }
      }
      if( rc==SQLITE_OK ){
        int nDestTruncate;
        /* Set nDestTruncate to the final number of pages in the destination
        ** database. The complication here is that the destination page
        ** size may be different to the source page size.
        **
        ** If the source page size is smaller than the destination page size,
        ** round up. In this case the call to sqlite3OsTruncate() below will
        ** fix the size of the file. However it is important to call
        ** sqlite3PagerTruncateImage() here so that any pages in the
        ** destination file that lie beyond the nDestTruncate page mark are
        ** journalled by PagerCommitPhaseOne() before they are destroyed
        ** by the file truncation.
        */
        assert( pgszSrc==sqlite3BtreeGetPageSize(p->pSrc) );
        assert( pgszDest==sqlite3BtreeGetPageSize(p->pDest) );
        if( pgszSrc<pgszDest ){
          int ratio = pgszDest/pgszSrc;
          nDestTruncate = (nSrcPage+ratio-1)/ratio;
          if( nDestTruncate==(int)PENDING_BYTE_PAGE(p->pDest->pBt) ){
            nDestTruncate--;
          }
        }else{
          nDestTruncate = nSrcPage * (pgszSrc/pgszDest);
        }
        assert( nDestTruncate>0 );

        if( pgszSrc<pgszDest ){
          /* If the source page-size is smaller than the destination page-size,
          ** two extra things may need to happen:
          **
          **   * The destination may need to be truncated, and
          **
          **   * Data stored on the pages immediately following the
          **     pending-byte page in the source database may need to be
          **     copied into the destination database.
          */
          const i64 iSize = (i64)pgszSrc * (i64)nSrcPage;
          sqlite3_file * const pFile = sqlite3PagerFile(pDestPager);
          Pgno iPg;
          int nDstPage;
          i64 iOff;
          i64 iEnd;

          assert( pFile );
          assert( nDestTruncate==0
              || (i64)nDestTruncate*(i64)pgszDest >= iSize || (
                nDestTruncate==(int)(PENDING_BYTE_PAGE(p->pDest->pBt)-1)
             && iSize>=PENDING_BYTE && iSize<=PENDING_BYTE+pgszDest
          ));

          /* This block ensures that all data required to recreate the original
          ** database has been stored in the journal for pDestPager and the
          ** journal synced to disk. So at this point we may safely modify
          ** the database file in any way, knowing that if a power failure
          ** occurs, the original database will be reconstructed from the
          ** journal file.  */
          sqlite3PagerPagecount(pDestPager, &nDstPage);
          for(iPg=nDestTruncate; rc==SQLITE_OK && iPg<=(Pgno)nDstPage; iPg++){
            if( iPg!=PENDING_BYTE_PAGE(p->pDest->pBt) ){
              DbPage *pPg;
              rc = sqlite3PagerGet(pDestPager, iPg, &pPg, 0);
              if( rc==SQLITE_OK ){
                rc = sqlite3PagerWrite(pPg);
                sqlite3PagerUnref(pPg);
              }
            }
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerCommitPhaseOne(pDestPager, 0, 1);
          }

          /* Write the extra pages and truncate the database file as required */
          iEnd = MIN(PENDING_BYTE + pgszDest, iSize);
          for(
            iOff=PENDING_BYTE+pgszSrc;
            rc==SQLITE_OK && iOff<iEnd;
            iOff+=pgszSrc
          ){
            PgHdr *pSrcPg = 0;
            const Pgno iSrcPg = (Pgno)((iOff/pgszSrc)+1);
            rc = sqlite3PagerGet(pSrcPager, iSrcPg, &pSrcPg, 0);
            if( rc==SQLITE_OK ){
              u8 *zData = sqlite3PagerGetData(pSrcPg);
              rc = sqlite3OsWrite(pFile, zData, pgszSrc, iOff);
            }
            sqlite3PagerUnref(pSrcPg);
          }
          if( rc==SQLITE_OK ){
            rc = backupTruncateFile(pFile, iSize);
          }

          /* Sync the database file to disk. */
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerSync(pDestPager, 0);
          }
        }else{
          sqlite3PagerTruncateImage(pDestPager, nDestTruncate);
          rc = sqlite3PagerCommitPhaseOne(pDestPager, 0, 0);
        }

        /* Finish committing the transaction to the destination database. */
        if( SQLITE_OK==rc
         && SQLITE_OK==(rc = sqlite3BtreeCommitPhaseTwo(p->pDest, 0))
        ){
          rc = SQLITE_DONE;
        }
      }
    }

    /* If bCloseTrans is true, then this function opened a read transaction
    ** on the source database. Close the read transaction here. There is
    ** no need to check the return values of the btree methods here, as
    ** "committing" a read-only transaction cannot fail.
    */
    if( bCloseTrans ){
      TESTONLY( int rc2 );
      TESTONLY( rc2  = ) sqlite3BtreeCommitPhaseOne(p->pSrc, 0);
      TESTONLY( rc2 |= ) sqlite3BtreeCommitPhaseTwo(p->pSrc, 0);
      assert( rc2==SQLITE_OK );
    }

    if( rc==SQLITE_IOERR_NOMEM ){
      rc = SQLITE_NOMEM_BKPT;
    }
    p->rc = rc;
  }
  if( p->pDestDb ){
    sqlite3_mutex_leave(p->pDestDb->mutex);
  }
  sqlite3BtreeLeave(p->pSrc);
  sqlite3_mutex_leave(p->pSrcDb->mutex);
  return rc;
}